

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O1

bool QFileSystemEngine::rmpath(QFileSystemEntry *entry)

{
  int iVar1;
  qsizetype qVar2;
  int *piVar3;
  __off_t extraout_RDX;
  __off_t __length;
  __off_t extraout_RDX_00;
  bool bVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  QMessageLogger local_70;
  QString local_50;
  QByteArray local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::filePath(&local_50,entry);
  QDir::cleanPath((QString *)&local_70,&local_50);
  QString::toLocal8Bit_helper
            (&local_38,(QChar *)CONCAT44(local_70.context.file._4_4_,local_70.context.file._0_4_),
             CONCAT44(local_70.context.function._4_4_,local_70.context.function._0_4_));
  piVar3 = (int *)CONCAT44(local_70.context.line,local_70.context.version);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_70.context.line,local_70.context.version),2,0x10);
    }
  }
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((undefined1 *)local_38.d.size == (undefined1 *)0x0) {
    local_70.context.version = 2;
    local_70.context.line = 0;
    local_70.context.file._0_4_ = 0;
    local_70.context.file._4_4_ = 0;
    local_70.context.function._0_4_ = 0;
    local_70.context.function._4_4_ = 0;
    local_70.context.category = "default";
    QMessageLogger::warning(&local_70,"Empty filename passed to function");
LAB_003c3434:
    piVar3 = __errno_location();
    *piVar3 = 0x16;
  }
  else {
    qVar2 = QByteArray::indexOf(&local_38,'\0',0);
    if (qVar2 != -1) {
      local_70.context.version = 2;
      local_70.context.line = 0;
      local_70.context.file._0_4_ = 0;
      local_70.context.file._4_4_ = 0;
      local_70.context.function._0_4_ = 0;
      local_70.context.function._4_4_ = 0;
      local_70.context.category = "default";
      QMessageLogger::warning(&local_70,"Broken filename passed to function");
      goto LAB_003c3434;
    }
    pcVar5 = local_38.d.ptr;
    if (local_38.d.ptr == (char *)0x0) {
      pcVar5 = "";
    }
    iVar1 = ::rmdir(pcVar5);
    if (iVar1 == 0) {
      pcVar5 = (char *)QByteArray::lastIndexOf(&local_38,'/',-1);
      __length = extraout_RDX;
      while (bVar4 = true, 0 < (long)pcVar5) {
        QByteArray::truncate(&local_38,pcVar5,__length);
        pcVar5 = local_38.d.ptr;
        if (local_38.d.ptr == (char *)0x0) {
          pcVar5 = "";
        }
        iVar1 = ::rmdir(pcVar5);
        if (iVar1 != 0) break;
        pcVar5 = (char *)QByteArray::lastIndexOf(&local_38,'/',-1);
        __length = extraout_RDX_00;
      }
      goto LAB_003c3327;
    }
  }
  bVar4 = false;
LAB_003c3327:
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemEngine::rmpath(const QFileSystemEntry &entry)
{
    QByteArray path = QFile::encodeName(QDir::cleanPath(entry.filePath()));
    Q_CHECK_FILE_NAME(path, false);

    if (::rmdir(path.constData()) != 0)
        return false; // Only return false if `entry` couldn't be deleted

    const char sep = QDir::separator().toLatin1();
    qsizetype slash = path.lastIndexOf(sep);
    // `slash > 0` because truncate(0) would make `path` empty
    for (; slash > 0; slash = path.lastIndexOf(sep)) {
        path.truncate(slash);
        if (::rmdir(path.constData()) != 0)
            break;
    }

    return true;
}